

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSTypeHandle_conflict FFS_target_from_encode(FFSContext c,char *data)

{
  FFSTypeHandle_conflict p_Var1;
  char *in_RDI;
  FFSContext unaff_retaddr;
  FFSTypeHandle_conflict f;
  FFSTypeHandle_conflict in_stack_fffffffffffffff8;
  FFSTypeHandle p_Var2;
  
  p_Var1 = FFSTypeHandle_from_encode((FFSContext)in_stack_fffffffffffffff8,in_RDI);
  if (p_Var1 == (FFSTypeHandle_conflict)0x0) {
    p_Var2 = (FFSTypeHandle)0x0;
  }
  else {
    if (p_Var1->status == not_checked) {
      FFS_determine_conversion(unaff_retaddr,in_stack_fffffffffffffff8);
    }
    if (p_Var1->status == none_available) {
      p_Var2 = (FFSTypeHandle)0x0;
    }
    else if (p_Var1->status == conversion_set) {
      p_Var2 = p_Var1->conversion_target;
    }
    else {
      p_Var2 = (FFSTypeHandle)0x0;
    }
  }
  return p_Var2;
}

Assistant:

extern FFSTypeHandle
FFS_target_from_encode(FFSContext c, char *data)
{
    FFSTypeHandle f;
    /* first element in encoded buffer is format ID */
    f = FFSTypeHandle_from_encode(c, data);
    if (f == NULL) return NULL;
    if (f->status == not_checked) {
	FFS_determine_conversion(c, f);
    }
    if (f->status == none_available) return NULL;
    if (f->status == conversion_set) return f->conversion_target;
    assert(0);
    return NULL;
}